

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O1

bool __thiscall
crnlib::rg_etc1::etc1_optimizer::evaluate_solution_fast
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  byte bVar1;
  uint uVar2;
  color_quad_u8 cVar3;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aVar4;
  params *ppVar5;
  color_quad_u8 *pcVar6;
  uint32 *puVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  undefined *puVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint c;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  undefined4 local_98;
  byte local_8c;
  byte local_8b;
  byte local_8a;
  long local_88;
  ulong local_80;
  ulong local_78;
  uint *local_70;
  color_quad_u8 block_colors [4];
  uint local_58 [4];
  etc1_solution_coordinates *local_48;
  potential_solution *local_40;
  undefined1 auStack_38 [4];
  uint block_inten_midpoints [3];
  uint block_inten [4];
  
  ppVar5 = this->m_pParams;
  if (ppVar5->m_constrain_against_base_color5 == true) {
    iVar9 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
            (uint)(ppVar5->m_base_color5).field_0.field_0.r;
    iVar13 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar5->m_base_color5).field_0.field_0.g;
    iVar11 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar5->m_base_color5).field_0.field_0.b;
    iVar17 = iVar13;
    if (iVar9 < iVar13) {
      iVar17 = iVar9;
    }
    if (iVar11 <= iVar17) {
      iVar17 = iVar11;
    }
    if (-5 < iVar17) {
      if (iVar13 < iVar9) {
        iVar13 = iVar9;
      }
      if (iVar13 <= iVar11) {
        iVar13 = iVar11;
      }
      if (iVar13 < 4) goto LAB_00193b46;
    }
    trial_solution->m_valid = false;
  }
  else {
LAB_00193b46:
    local_40 = pBest_solution;
    bVar1 = (coords->m_unscaled_color).field_0.field_0.r;
    local_48 = coords;
    if (coords->m_color4 == true) {
      uVar19 = (uint)bVar1 << 4 | (uint)bVar1;
      uVar14 = (uint)(coords->m_unscaled_color).field_0.field_0.g;
      uVar14 = uVar14 << 4 | uVar14;
      uVar16 = (uint)(coords->m_unscaled_color).field_0.field_0.b;
      uVar16 = uVar16 << 4 | uVar16;
    }
    else {
      uVar19 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
      bVar1 = (coords->m_unscaled_color).field_0.field_0.g;
      uVar14 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
      bVar1 = (coords->m_unscaled_color).field_0.field_0.b;
      uVar16 = (uint)bVar1 << 3 | (uint)(bVar1 >> 2);
    }
    if (0xfe < uVar19) {
      uVar19 = 0xff;
    }
    uVar20 = (ulong)uVar19;
    if (0xfe < uVar14) {
      uVar14 = 0xff;
    }
    uVar15 = (ulong)uVar14;
    if (0xfe < uVar16) {
      uVar16 = 0xff;
    }
    trial_solution->m_error = 0xffffffffffffffff;
    local_88 = 7;
    puVar12 = &DAT_001ae2a0;
    local_78 = uVar15;
    local_80 = uVar20;
    do {
      lVar10 = 0;
      do {
        iVar17 = *(int *)(puVar12 + lVar10 * 4);
        uVar19 = iVar17 + (int)uVar20;
        iVar13 = iVar17 + (int)uVar15;
        iVar17 = iVar17 + uVar16;
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if (0xfe < (int)uVar19) {
          uVar19 = 0xff;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        if (0xfe < iVar17) {
          iVar17 = 0xff;
        }
        (&local_98)[lVar10] = iVar13 << 8 | iVar17 << 0x10 | uVar19;
        local_58[lVar10] = iVar13 + uVar19 + iVar17;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      block_colors[1].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
           (anon_union_4_3_dd316fa8_for_color_quad_u8_0)(local_58[1] + local_58[0]);
      block_colors[2].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
           (anon_union_4_3_dd316fa8_for_color_quad_u8_0)(local_58[1] + local_58[2]);
      block_colors[3].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
           (anon_union_4_3_dd316fa8_for_color_quad_u8_0)(local_58[2] + local_58[3]);
      local_70 = this->m_pSorted_luma;
      pcVar6 = this->m_pParams->m_pSrc_pixels;
      uVar19 = local_70[7];
      if (uVar19 * 2 < local_58[1] + local_58[0]) {
        if ((local_58[0] < uVar19 || local_58[0] - uVar19 == 0) ||
           ((ulong)(local_58[0] - uVar19) < trial_solution->m_error)) {
          this->m_temp_selectors[0] = '\0';
          this->m_temp_selectors[1] = '\0';
          this->m_temp_selectors[2] = '\0';
          this->m_temp_selectors[3] = '\0';
          this->m_temp_selectors[4] = '\0';
          this->m_temp_selectors[5] = '\0';
          this->m_temp_selectors[6] = '\0';
          this->m_temp_selectors[7] = '\0';
          lVar10 = 0;
          uVar18 = 0;
          do {
            iVar17 = (uint)(byte)local_98 - (uint)pcVar6[lVar10].field_0.field_0.r;
            iVar9 = (uint)local_98._1_1_ - (uint)pcVar6[lVar10].field_0.field_0.g;
            iVar13 = (uint)local_98._2_1_ - (uint)pcVar6[lVar10].field_0.field_0.b;
            uVar18 = uVar18 + (uint)(iVar13 * iVar13 + iVar9 * iVar9 + iVar17 * iVar17);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          goto LAB_00193edb;
        }
LAB_00193f2c:
        bVar21 = false;
      }
      else {
        uVar19 = *local_70;
        if (uVar19 * 2 < local_58[2] + local_58[3]) {
          _auStack_38 = this->m_pSorted_luma_indices;
          uVar20 = 0;
          uVar19 = 0;
          uVar18 = 0;
          do {
            uVar2 = local_70[uVar20];
            uVar14 = uVar19 + 1;
            if (uVar14 < 4) {
              uVar14 = 3;
            }
            do {
              uVar15 = (ulong)uVar19;
              cVar3.field_0 =
                   (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
                   block_colors[uVar15 + 1].field_0.m_u32;
              if (uVar2 * 2 < (uint)cVar3.field_0) {
                uVar14 = _auStack_38[uVar20];
                this->m_temp_selectors[uVar14] = (uint8)uVar19;
                iVar9 = (uint)*(byte *)(&local_98 + uVar15) - (uint)pcVar6[uVar14].field_0.field_0.r
                ;
                iVar17 = (uint)*(byte *)((long)&local_98 + uVar15 * 4 + 1) -
                         (uint)pcVar6[uVar14].field_0.field_0.g;
                iVar13 = (uint)*(byte *)((long)&local_98 + uVar15 * 4 + 2) -
                         (uint)pcVar6[uVar14].field_0.field_0.b;
                uVar18 = uVar18 + (uint)(iVar13 * iVar13 + iVar17 * iVar17 + iVar9 * iVar9);
                uVar14 = uVar19;
                break;
              }
              uVar19 = uVar19 + 1;
            } while (uVar14 != uVar19);
            uVar19 = uVar14;
            if ((uint)cVar3.field_0 <= uVar2 * 2) goto LAB_00193de1;
            uVar20 = uVar20 + 1;
          } while (uVar20 != 8);
          uVar20 = 8;
LAB_00193de1:
          if ((uint)uVar20 < 8) {
            puVar7 = this->m_pSorted_luma_indices;
            uVar20 = uVar20 & 0xffffffff;
            do {
              uVar19 = puVar7[uVar20];
              this->m_temp_selectors[uVar19] = '\x03';
              iVar9 = (uint)local_8c - (uint)pcVar6[uVar19].field_0.field_0.r;
              iVar17 = (uint)local_8b - (uint)pcVar6[uVar19].field_0.field_0.g;
              iVar13 = (uint)local_8a - (uint)pcVar6[uVar19].field_0.field_0.b;
              uVar18 = uVar18 + (uint)(iVar13 * iVar13 + iVar17 * iVar17 + iVar9 * iVar9);
              uVar20 = uVar20 + 1;
            } while (uVar20 != 8);
          }
        }
        else {
          if ((local_58[3] <= uVar19 && uVar19 - local_58[3] != 0) &&
             (trial_solution->m_error <= (ulong)(uVar19 - local_58[3]))) goto LAB_00193f2c;
          builtin_memcpy(this->m_temp_selectors,"\x03\x03\x03\x03\x03\x03\x03\x03",8);
          lVar10 = 0;
          uVar18 = 0;
          do {
            iVar17 = (uint)local_8c - (uint)pcVar6[lVar10].field_0.field_0.r;
            iVar9 = (uint)local_8b - (uint)pcVar6[lVar10].field_0.field_0.g;
            iVar13 = (uint)local_8a - (uint)pcVar6[lVar10].field_0.field_0.b;
            uVar18 = uVar18 + (uint)(iVar13 * iVar13 + iVar9 * iVar9 + iVar17 * iVar17);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
        }
LAB_00193edb:
        uVar15 = local_78;
        uVar20 = local_80;
        if (uVar18 < trial_solution->m_error) {
          trial_solution->m_error = uVar18;
          (trial_solution->m_coords).m_inten_table = (uint)local_88;
          *(undefined8 *)trial_solution->m_selectors = *(undefined8 *)this->m_temp_selectors;
          trial_solution->m_valid = true;
          if (uVar18 == 0) {
            bVar21 = true;
            goto LAB_00193f17;
          }
        }
        bVar21 = false;
      }
LAB_00193f17:
      if (bVar21) break;
      puVar12 = puVar12 + -0x10;
      bVar21 = local_88 != 0;
      local_88 = local_88 + -1;
    } while (bVar21);
    aVar4 = (coords->m_unscaled_color).field_0;
    (trial_solution->m_coords).m_unscaled_color.field_0 = aVar4;
    (trial_solution->m_coords).m_color4 = this->m_pParams->m_use_color4;
    if ((pBest_solution != (potential_solution *)0x0) &&
       (trial_solution->m_error < pBest_solution->m_error)) {
      (pBest_solution->m_coords).m_unscaled_color.field_0 = aVar4;
      (pBest_solution->m_coords).m_inten_table = (trial_solution->m_coords).m_inten_table;
      (pBest_solution->m_coords).m_color4 = (trial_solution->m_coords).m_color4;
      uVar8 = *(undefined8 *)&trial_solution->field_0x14;
      *(undefined8 *)pBest_solution->m_selectors = *(undefined8 *)trial_solution->m_selectors;
      *(undefined8 *)&pBest_solution->field_0x14 = uVar8;
      *(undefined8 *)((long)&pBest_solution->m_error + 1) =
           *(undefined8 *)((long)&trial_solution->m_error + 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution_fast(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution)
        {
            if (m_pParams->m_constrain_against_base_color5)
            {
                const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
                const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
                const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

                if ((rg_etc1::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (rg_etc1::maximum(dr, dg, db) > cETC1ColorDeltaMax))
                {
                    trial_solution.m_valid = false;
                    return false;
                }
            }

            const color_quad_u8 base_color(coords.get_scaled_color());

            const uint n = 8;

            trial_solution.m_error = cUINT64_MAX;

            for (int inten_table = cETC1IntenModifierValues - 1; inten_table >= 0; --inten_table)
            {
                const int* pInten_table = g_etc1_inten_tables[inten_table];

                uint block_inten[4];
                color_quad_u8 block_colors[4];
                for (uint s = 0; s < 4; s++)
                {
                    const int yd = pInten_table[s];
                    color_quad_u8 block_color(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
                    block_colors[s] = block_color;
                    block_inten[s] = block_color.r + block_color.g + block_color.b;
                }

                // evaluate_solution_fast() enforces/assumesd a total ordering of the input colors along the intensity (1,1,1) axis to more quickly classify the inputs to selectors.
                // The inputs colors have been presorted along the projection onto this axis, and ETC1 block colors are always ordered along the intensity axis, so this classification is fast.
                // 0   1   2   3
                //   01  12  23
                const uint block_inten_midpoints[3] = { block_inten[0] + block_inten[1], block_inten[1] + block_inten[2], block_inten[2] + block_inten[3] };

                uint64 total_error = 0;
                const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
                if ((m_pSorted_luma[n - 1] * 2) < block_inten_midpoints[0])
                {
                    if (block_inten[0] > m_pSorted_luma[n - 1])
                    {
                        const uint min_error = block_inten[0] - m_pSorted_luma[n - 1];
                        if (min_error >= trial_solution.m_error)
                        {
                            continue;
                        }
                    }

                    memset(&m_temp_selectors[0], 0, n);

                    for (uint c = 0; c < n; c++)
                    {
                        total_error += block_colors[0].squared_distance_rgb(pSrc_pixels[c]);
                    }
                }
                else if ((m_pSorted_luma[0] * 2) >= block_inten_midpoints[2])
                {
                    if (m_pSorted_luma[0] > block_inten[3])
                    {
                        const uint min_error = m_pSorted_luma[0] - block_inten[3];
                        if (min_error >= trial_solution.m_error)
                        {
                            continue;
                        }
                    }

                    memset(&m_temp_selectors[0], 3, n);

                    for (uint c = 0; c < n; c++)
                    {
                        total_error += block_colors[3].squared_distance_rgb(pSrc_pixels[c]);
                    }
                }
                else
                {
                    uint cur_selector = 0, c;
                    for (c = 0; c < n; c++)
                    {
                        const uint y = m_pSorted_luma[c];
                        while ((y * 2) >= block_inten_midpoints[cur_selector])
                        {
                            if (++cur_selector > 2)
                            {
                                goto done;
                            }
                        }
                        const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                        m_temp_selectors[sorted_pixel_index] = static_cast<uint8>(cur_selector);
                        total_error += block_colors[cur_selector].squared_distance_rgb(pSrc_pixels[sorted_pixel_index]);
                    }
                done:
                    while (c < n)
                    {
                        const uint sorted_pixel_index = m_pSorted_luma_indices[c];
                        m_temp_selectors[sorted_pixel_index] = 3;
                        total_error += block_colors[3].squared_distance_rgb(pSrc_pixels[sorted_pixel_index]);
                        ++c;
                    }
                }

                if (total_error < trial_solution.m_error)
                {
                    trial_solution.m_error = total_error;
                    trial_solution.m_coords.m_inten_table = inten_table;
                    memcpy(trial_solution.m_selectors, m_temp_selectors, n);
                    trial_solution.m_valid = true;
                    if (!total_error)
                    {
                        break;
                    }
                }
            }
            trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
            trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

            bool success = false;
            if (pBest_solution)
            {
                if (trial_solution.m_error < pBest_solution->m_error)
                {
                    *pBest_solution = trial_solution;
                    success = true;
                }
            }

            return success;
        }